

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.cpp
# Opt level: O0

int higan::Codec::HexCharArrayToInt(char *begin,char *end)

{
  anon_class_16_2_140c63e0 __f;
  int local_4c;
  int local_28;
  int local_24;
  int result;
  int index;
  char *end_local;
  char *begin_local;
  
  if (begin < end) {
    local_24 = ((int)end - (int)begin) + -1;
    local_28 = 0;
    __f.index = &local_24;
    __f.result = &local_28;
    _result = end;
    end_local = begin;
    std::for_each<char_const*,higan::Codec::HexCharArrayToInt(char_const*,char_const*)::__0>
              (begin,end,__f);
    if (local_28 < 0) {
      local_4c = -1;
    }
    else {
      local_4c = local_28;
    }
    begin_local._4_4_ = local_4c;
  }
  else {
    begin_local._4_4_ = -1;
  }
  return begin_local._4_4_;
}

Assistant:

int Codec::HexCharArrayToInt(const char* begin, const char* end)
{
	if (end <= begin)
	{
		return -1;
	}

	int index = end - begin - 1;

	int result = 0;

	std::for_each(begin, end, [&](char i)
	{
		result += std::pow(16, index--) * HexCharToInt(i);
	});

	return result < 0 ? -1 : result;
}